

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::TrackValueInfoChangeForKills
          (GlobOpt *this,BasicBlock *block,Value *value,ValueInfo *newValueInfo,bool compensated)

{
  ValueType *pVVar1;
  ValueInfo *valueInfo;
  BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ArrayValueInfo *pAVar5;
  undefined7 in_register_00000081;
  bool bVar6;
  bool bVar7;
  Value *local_50;
  GlobOpt *local_48;
  undefined4 local_3c;
  Value *local_38;
  Value *value_local;
  
  local_48 = this;
  local_38 = value;
  if (block == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32f4,"(block)","block");
    if (!bVar3) goto LAB_004655c0;
    *puVar4 = 0;
  }
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32f5,"(value)","value");
    if (!bVar3) goto LAB_004655c0;
    *puVar4 = 0;
  }
  if (newValueInfo == (ValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32f6,"(newValueInfo)","newValueInfo");
    if (!bVar3) goto LAB_004655c0;
    *puVar4 = 0;
  }
  valueInfo = value->valueInfo;
  pVVar1 = &valueInfo->super_ValueType;
  bVar3 = ValueType::IsAnyOptimizedArray(pVVar1);
  if (bVar3) {
    bVar3 = ValueType::IsArrayOrObjectWithArray(pVVar1);
    VerifyArrayValueInfoForTracking(local_48,valueInfo,bVar3,block,compensated);
  }
  local_3c = (undefined4)CONCAT71(in_register_00000081,compensated);
  bVar3 = ValueType::IsArrayOrObjectWithArray(pVVar1);
  bVar6 = true;
  if (!bVar3) {
    bVar3 = ValueType::IsOptimizedVirtualTypedArray(pVVar1);
    if (!bVar3) {
      bVar3 = ValueType::IsOptimizedTypedArray(pVVar1);
      bVar6 = false;
      if (bVar3) {
        bVar3 = ValueInfo::IsArrayValueInfo(valueInfo);
        if (bVar3) {
          pAVar5 = ValueInfo::AsArrayValueInfo(valueInfo);
          bVar6 = pAVar5->headSegmentLengthSym != (StackSym *)0x0;
        }
      }
    }
  }
  bVar3 = JsUtil::
          BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(&((block->globOptData).valuesToKillOnCalls)->
                         super_BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                        ,&local_38);
  if (bVar6 != bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3309,
                       "(trackOldValueInfo == block->globOptData.valuesToKillOnCalls->ContainsKey(value))"
                       ,
                       "trackOldValueInfo == block->globOptData.valuesToKillOnCalls->ContainsKey(value)"
                      );
    if (!bVar3) {
LAB_004655c0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pVVar1 = &newValueInfo->super_ValueType;
  bVar3 = ValueType::IsAnyOptimizedArray(pVVar1);
  if (bVar3) {
    bVar3 = ValueType::IsArrayOrObjectWithArray(pVVar1);
    VerifyArrayValueInfoForTracking(local_48,newValueInfo,bVar3,block,local_3c._0_1_);
  }
  bVar3 = ValueType::IsArrayOrObjectWithArray(pVVar1);
  bVar7 = true;
  if (!bVar3) {
    bVar3 = ValueType::IsOptimizedVirtualTypedArray(pVVar1);
    if (!bVar3) {
      bVar3 = ValueType::IsOptimizedTypedArray(pVVar1);
      if (bVar3) {
        bVar3 = ValueInfo::IsArrayValueInfo(newValueInfo);
        if (bVar3) {
          pAVar5 = ValueInfo::AsArrayValueInfo(newValueInfo);
          bVar7 = pAVar5->headSegmentLengthSym != (StackSym *)0x0;
          goto LAB_00465577;
        }
      }
      bVar7 = false;
    }
  }
LAB_00465577:
  if (bVar6 != bVar7) {
    this_00 = &((block->globOptData).valuesToKillOnCalls)->
               super_BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ;
    if (bVar7 == false) {
      local_50 = local_38;
      JsUtil::
      BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Remove(this_00,&local_50);
    }
    else {
      local_50 = local_38;
      JsUtil::
      BaseDictionary<Value*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<Value*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<Value*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                  *)this_00,&local_50,&local_38);
    }
  }
  return;
}

Assistant:

void
GlobOpt::TrackValueInfoChangeForKills(BasicBlock *const block, Value *const value, ValueInfo *const newValueInfo, const bool compensated) const
{
    Assert(block);
    Assert(value);
    Assert(newValueInfo);

    ValueInfo *const oldValueInfo = value->GetValueInfo();

#if DBG
    if(oldValueInfo->IsAnyOptimizedArray())
    {
        VerifyArrayValueInfoForTracking(oldValueInfo, oldValueInfo->IsArrayOrObjectWithArray(), block, compensated);
    }
#endif

    const bool trackOldValueInfo =
        oldValueInfo->IsArrayOrObjectWithArray() ||
        oldValueInfo->IsOptimizedVirtualTypedArray() ||
        (
            oldValueInfo->IsOptimizedTypedArray() &&
            oldValueInfo->IsArrayValueInfo() &&
            oldValueInfo->AsArrayValueInfo()->HeadSegmentLengthSym()
        );
    Assert(trackOldValueInfo == block->globOptData.valuesToKillOnCalls->ContainsKey(value));

#if DBG
    if(newValueInfo->IsAnyOptimizedArray())
    {
        VerifyArrayValueInfoForTracking(newValueInfo, newValueInfo->IsArrayOrObjectWithArray(), block, compensated);
    }
#endif

    const bool trackNewValueInfo =
        newValueInfo->IsArrayOrObjectWithArray() ||
        newValueInfo->IsOptimizedVirtualTypedArray() ||
        (
            newValueInfo->IsOptimizedTypedArray() &&
            newValueInfo->IsArrayValueInfo() &&
            newValueInfo->AsArrayValueInfo()->HeadSegmentLengthSym()
        );

    if(trackOldValueInfo == trackNewValueInfo)
    {
        return;
    }

    if(trackNewValueInfo)
    {
        block->globOptData.valuesToKillOnCalls->Add(value);
    }
    else
    {
        block->globOptData.valuesToKillOnCalls->Remove(value);
    }
}